

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FilterFederate.cpp
# Opt level: O2

void __thiscall helics::FilterFederate::~FilterFederate(FilterFederate *this)

{
  this->mHandles = (HandleManager *)0x0;
  this->current_state = CREATED;
  std::
  _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
  ::clear(&(this->filterCoord)._M_t);
  std::function<void_(const_helics::ActionMessage_&)>::operator=
            (&this->mQueueMessage,(nullptr_t)0x0);
  std::function<void_(helics::ActionMessage_&&)>::operator=(&this->mQueueMessageMove,(nullptr_t)0x0)
  ;
  std::function<void_(const_helics::ActionMessage_&)>::operator=(&this->mSendMessage,(nullptr_t)0x0)
  ;
  std::function<void_(helics::ActionMessage_&&)>::operator=(&this->mSendMessageMove,(nullptr_t)0x0);
  std::function<void_(helics::ActionMessage_&)>::operator=(&this->mDeliverMessage,(nullptr_t)0x0);
  std::
  function<void_(int,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  ::operator=(&this->mLogger,(nullptr_t)0x0);
  std::function<gmlc::containers::AirLock<std::any,_std::mutex,_std::condition_variable>_&(int)>::
  operator=(&this->mGetAirLock,(nullptr_t)0x0);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::clear(&(this->ongoingFilterProcesses)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::clear(&(this->ongoingDestFilterProcesses)._M_t);
  gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::clear
            (&this->filters);
  gmlc::containers::MappedPointerVector<helics::FilterInfo,_helics::GlobalHandle>::
  ~MappedPointerVector(&this->filters);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&(this->ongoingDestFilterProcesses)._M_t);
  std::
  _Rb_tree<int,_std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&(this->ongoingFilterProcesses)._M_t);
  std::
  _Deque_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
  ::~_Deque_base(&(this->timeBlockProcesses).
                  super__Deque_base<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>,_std::allocator<std::pair<int,_TimeRepresentation<count_time<9,_long>_>_>_>_>
                );
  std::_Function_base::~_Function_base(&(this->mGetAirLock).super__Function_base);
  std::_Function_base::~_Function_base(&(this->mLogger).super__Function_base);
  std::_Function_base::~_Function_base(&(this->mDeliverMessage).super__Function_base);
  std::_Function_base::~_Function_base(&(this->mSendMessageMove).super__Function_base);
  std::_Function_base::~_Function_base(&(this->mSendMessage).super__Function_base);
  std::_Function_base::~_Function_base(&(this->mQueueMessageMove).super__Function_base);
  std::_Function_base::~_Function_base(&(this->mQueueMessage).super__Function_base);
  std::
  _Rb_tree<helics::InterfaceHandle,_std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>,_std::_Select1st<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>,_std::less<helics::InterfaceHandle>,_std::allocator<std::pair<const_helics::InterfaceHandle,_std::unique_ptr<helics::FilterCoordinator,_std::default_delete<helics::FilterCoordinator>_>_>_>_>
  ::~_Rb_tree(&(this->filterCoord)._M_t);
  TimeCoordinator::~TimeCoordinator(&this->mCoord);
  std::__cxx11::string::~string((string *)&this->mName);
  return;
}

Assistant:

FilterFederate::~FilterFederate()
{
    mHandles = nullptr;
    current_state = FederateStates::CREATED;
    /// map of all local filters
    filterCoord.clear();
    // The interface_handle used is here is usually referencing an endpoint

    mQueueMessage = nullptr;
    mQueueMessageMove = nullptr;
    mSendMessage = nullptr;
    mSendMessageMove = nullptr;

    mDeliverMessage = nullptr;

    mLogger = nullptr;
    mGetAirLock = nullptr;

    /// sets of ongoing filtered messages
    ongoingFilterProcesses.clear();
    /// sets of ongoing destination filter processing
    ongoingDestFilterProcesses.clear();

    filters.clear();
}